

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

int Imf_2_5::anon_unknown_12::calculateNumXLevels
              (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY)

{
  ArgExc *this;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int w_1;
  int h;
  int w;
  int num;
  LevelRoundingMode in_stack_ffffffffffffffd0;
  int x;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  x = *(int *)(in_RDI + 8);
  if (x == 0) {
    local_1c = 1;
  }
  else if (x == 1) {
    local_20 = (in_EDX - in_ESI) + 1;
    local_24 = (in_R8D - in_ECX) + 1;
    std::max<int>(&local_20,&local_24);
    local_1c = roundLog2(x,in_stack_ffffffffffffffd0);
    local_1c = local_1c + 1;
  }
  else {
    if (x != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this,"Unknown LevelMode format.");
      __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    local_1c = roundLog2(2,in_stack_ffffffffffffffd0);
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int
calculateNumXLevels (const TileDescription& tileDesc,
		     int minX, int maxX,
		     int minY, int maxY)
{
    int num = 0;

    switch (tileDesc.mode)
    {
      case ONE_LEVEL:

	num = 1;
	break;

      case MIPMAP_LEVELS:

	{
	  int w = maxX - minX + 1;
	  int h = maxY - minY + 1;
	  num = roundLog2 (std::max (w, h), tileDesc.roundingMode) + 1;
	}
        break;

      case RIPMAP_LEVELS:

	{
	  int w = maxX - minX + 1;
	  num = roundLog2 (w, tileDesc.roundingMode) + 1;
	}
	break;

      default:

	throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    return num;
}